

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

int __thiscall cmCTestTestHandler::ProcessHandler(cmCTestTestHandler *this)

{
  cmCTest *pcVar1;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  NoTests NVar5;
  int iVar6;
  ostream *poVar7;
  long lVar8;
  long lVar9;
  _Base_ptr p_Var10;
  string *j;
  pointer pbVar11;
  char *pcVar12;
  char *name;
  string_view str;
  vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
  disabledTests;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  failed;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  passed;
  cmDuration durationInSecs;
  ostringstream cmCTestLog_msg_1;
  _Rb_tree_node_base local_408 [11];
  cmGeneratedFileStream mLogFile;
  
  bVar3 = ProcessOptions(this);
  iVar6 = -1;
  if (bVar3) {
    std::
    vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
    ::clear(&this->TestResults);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&mLogFile);
    pcVar12 = "Memory check";
    name = "Test";
    if (this->MemCheck == false) {
      pcVar12 = "Test";
    }
    poVar7 = std::operator<<((ostream *)&mLogFile,pcVar12);
    poVar7 = std::operator<<(poVar7," project ");
    cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
    poVar7 = std::operator<<(poVar7,(string *)&cmCTestLog_msg_1);
    std::endl<char,std::char_traits<char>>(poVar7);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x1a0,_cmCTestLog_msg_1,(this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&mLogFile);
    iVar4 = (*(this->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[6])(this);
    if (iVar4 != 0) {
      cmGeneratedFileStream::cmGeneratedFileStream(&mLogFile,None);
      if (this->MemCheck != false) {
        name = "DynamicAnalysis";
      }
      cmCTestGenericHandler::StartLogFile(&this->super_cmCTestGenericHandler,name,&mLogFile);
      this->LogFile = (ostream *)&mLogFile;
      passed.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      passed.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      passed.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      failed.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      failed.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      failed.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar8 = std::chrono::_V2::steady_clock::now();
      bVar3 = ProcessDirectory(this,&passed,&failed);
      iVar6 = -1;
      if (bVar3) {
        lVar9 = std::chrono::_V2::steady_clock::now();
        if (((long)failed.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)failed.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5) +
            ((long)passed.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)passed.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5) == 0) {
          bVar3 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
          iVar4 = 0;
          if (!bVar3) {
            bVar3 = cmCTest::ShouldPrintLabels((this->super_cmCTestGenericHandler).CTest);
            iVar4 = 0;
            if (!bVar3) {
              NVar5 = cmCTest::GetNoTestsMode((this->super_cmCTestGenericHandler).CTest);
              if (NVar5 != Ignore) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_1);
                poVar7 = std::operator<<((ostream *)&cmCTestLog_msg_1,"No tests were found!!!");
                std::endl<char,std::char_traits<char>>(poVar7);
                pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::stringbuf::str();
                cmCTest::Log(pcVar1,7,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                             ,0x1ba,(char *)disabledTests.
                                            super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                                            ._M_impl.super__Vector_impl_data._M_start,false);
                std::__cxx11::string::~string((string *)&disabledTests);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_1);
                NVar5 = cmCTest::GetNoTestsMode((this->super_cmCTestGenericHandler).CTest);
                iVar4 = -(uint)(NVar5 == Error);
              }
            }
          }
        }
        else {
          if (((passed.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                passed.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) &&
              ((this->super_cmCTestGenericHandler).HandlerVerbose != OUTPUT_NONE)) &&
             ((this->UseIncludeRegExpFlag != false || (this->UseExcludeRegExpFlag == true)))) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_1);
            poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&cmCTestLog_msg_1);
            poVar7 = std::operator<<(poVar7,"The following tests passed:");
            std::endl<char,std::char_traits<char>>(poVar7);
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar1,5,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                         ,0x1c5,(char *)disabledTests.
                                        super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                         (this->super_cmCTestGenericHandler).Quiet);
            std::__cxx11::string::~string((string *)&disabledTests);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_1);
            pbVar2 = passed.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pbVar11 = passed.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar2;
                pbVar11 = pbVar11 + 1) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_1);
              poVar7 = std::operator<<((ostream *)&cmCTestLog_msg_1,"\t");
              poVar7 = std::operator<<(poVar7,(string *)pbVar11);
              std::endl<char,std::char_traits<char>>(poVar7);
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar1,5,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                           ,0x1c8,(char *)disabledTests.
                                          super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                           (this->super_cmCTestGenericHandler).Quiet);
              std::__cxx11::string::~string((string *)&disabledTests);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_1);
            }
          }
          std::
          set<cmCTestTestHandler::cmCTestTestResult,cmCTestTestHandler::cmCTestTestResultLess,std::allocator<cmCTestTestHandler::cmCTestTestResult>>
          ::
          set<__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestResult*,std::vector<cmCTestTestHandler::cmCTestTestResult,std::allocator<cmCTestTestHandler::cmCTestTestResult>>>>
                    ((set<cmCTestTestHandler::cmCTestTestResult,cmCTestTestHandler::cmCTestTestResultLess,std::allocator<cmCTestTestHandler::cmCTestTestResult>>
                      *)&cmCTestLog_msg_1,
                     (this->TestResults).
                     super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->TestResults).
                     super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          disabledTests.
          super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          disabledTests.
          super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          disabledTests.
          super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          for (p_Var10 = local_408[0]._M_left; p_Var10 != local_408;
              p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
            str._M_str = *(char **)(p_Var10 + 8);
            str._M_len = (size_t)p_Var10[8]._M_parent;
            bVar3 = cmHasLiteralPrefix<6ul>(str,(char (*) [6])"SKIP_");
            if (bVar3) {
LAB_001d8c7f:
              std::
              vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
              ::push_back(&disabledTests,(value_type *)(p_Var10 + 1));
            }
            else {
              bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(p_Var10 + 8),"Disabled");
              if (bVar3) goto LAB_001d8c7f;
            }
          }
          durationInSecs.__r = (double)(lVar9 - lVar8) / 1000000000.0;
          LogTestSummary(this,&passed,&failed,&durationInSecs);
          LogDisabledTests(this,&disabledTests);
          LogFailedTests(this,&failed,(SetOfTests *)&cmCTestLog_msg_1);
          std::
          vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
          ::~vector(&disabledTests);
          std::
          _Rb_tree<cmCTestTestHandler::cmCTestTestResult,_cmCTestTestHandler::cmCTestTestResult,_std::_Identity<cmCTestTestHandler::cmCTestTestResult>,_cmCTestTestHandler::cmCTestTestResultLess,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
          ::~_Rb_tree((_Rb_tree<cmCTestTestHandler::cmCTestTestResult,_cmCTestTestHandler::cmCTestTestResult,_std::_Identity<cmCTestTestHandler::cmCTestTestResult>,_cmCTestTestHandler::cmCTestTestResultLess,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                       *)&cmCTestLog_msg_1);
          iVar4 = 0;
        }
        bVar3 = GenerateXML(this);
        iVar6 = 1;
        if (bVar3) {
          bVar3 = WriteJUnitXML(this);
          if (bVar3) {
            iVar6 = (*(this->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[7])(this);
            if (iVar6 == 0) {
              this->LogFile = (ostream *)0x0;
              iVar6 = -1;
            }
            else {
              iVar6 = -1;
              if (failed.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  failed.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                iVar6 = iVar4;
              }
              this->LogFile = (ostream *)0x0;
            }
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&failed);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&passed);
      cmGeneratedFileStream::~cmGeneratedFileStream(&mLogFile);
    }
  }
  return iVar6;
}

Assistant:

int cmCTestTestHandler::ProcessHandler()
{
  if (!this->ProcessOptions()) {
    return -1;
  }

  this->TestResults.clear();

  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     (this->MemCheck ? "Memory check" : "Test")
                       << " project "
                       << cmSystemTools::GetCurrentWorkingDirectory()
                       << std::endl,
                     this->Quiet);
  if (!this->PreProcessHandler()) {
    return -1;
  }

  cmGeneratedFileStream mLogFile;
  this->StartLogFile((this->MemCheck ? "DynamicAnalysis" : "Test"), mLogFile);
  this->LogFile = &mLogFile;

  std::vector<std::string> passed;
  std::vector<std::string> failed;

  // start the real time clock
  auto clock_start = std::chrono::steady_clock::now();

  if (!this->ProcessDirectory(passed, failed)) {
    return -1;
  }

  auto clock_finish = std::chrono::steady_clock::now();

  bool noTestsFoundError = false;
  if (passed.size() + failed.size() == 0) {
    if (!this->CTest->GetShowOnly() && !this->CTest->ShouldPrintLabels() &&
        this->CTest->GetNoTestsMode() != cmCTest::NoTests::Ignore) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "No tests were found!!!" << std::endl);
      if (this->CTest->GetNoTestsMode() == cmCTest::NoTests::Error) {
        noTestsFoundError = true;
      }
    }
  } else {
    if (this->HandlerVerbose && !passed.empty() &&
        (this->UseIncludeRegExpFlag || this->UseExcludeRegExpFlag)) {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         std::endl
                           << "The following tests passed:" << std::endl,
                         this->Quiet);
      for (std::string const& j : passed) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "\t" << j << std::endl, this->Quiet);
      }
    }

    SetOfTests resultsSet(this->TestResults.begin(), this->TestResults.end());
    std::vector<cmCTestTestHandler::cmCTestTestResult> disabledTests;

    for (cmCTestTestResult const& ft : resultsSet) {
      if (cmHasLiteralPrefix(ft.CompletionStatus, "SKIP_") ||
          ft.CompletionStatus == "Disabled") {
        disabledTests.push_back(ft);
      }
    }

    cmDuration durationInSecs = clock_finish - clock_start;
    this->LogTestSummary(passed, failed, durationInSecs);

    this->LogDisabledTests(disabledTests);

    this->LogFailedTests(failed, resultsSet);
  }

  if (!this->GenerateXML()) {
    return 1;
  }

  if (!this->WriteJUnitXML()) {
    return 1;
  }

  if (!this->PostProcessHandler()) {
    this->LogFile = nullptr;
    return -1;
  }

  if (!failed.empty()) {
    this->LogFile = nullptr;
    return -1;
  }

  if (noTestsFoundError) {
    this->LogFile = nullptr;
    return -1;
  }

  this->LogFile = nullptr;
  return 0;
}